

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_emit.cpp
# Opt level: O3

void __thiscall pstore::exchange::export_ns::emit_digest(export_ns *this,ostream_base *os,uint128 d)

{
  byte bVar1;
  ulong uVar2;
  char cVar3;
  size_t __n;
  ulong in_RDX;
  void *__buf;
  void *__buf_00;
  int iVar4;
  uint uVar5;
  long lVar6;
  char local_48 [32];
  
  lVar6 = 0;
  uVar2 = 0x7c;
  do {
    __n = uVar2;
    iVar4 = (int)__n;
    bVar1 = (byte)__n & 0x3f;
    uVar5 = (uint)(in_RDX >> ((byte)__n & 0x3f));
    if ((__n & 0x40) == 0) {
      uVar5 = (uint)((ulong)os >> bVar1) | (uint)(in_RDX << 0x40 - bVar1);
    }
    cVar3 = uint128::digit_to_hex(uVar5 & 0xf);
    local_48[lVar6] = cVar3;
    lVar6 = lVar6 + 1;
    uVar2 = (ulong)(iVar4 - 4);
  } while (lVar6 != 0x20);
  ostream_base::write((ostream_base *)this,0x22,__buf,__n);
  ostream_base::write((ostream_base *)this,(int)local_48,(void *)0x20,__n);
  ostream_base::write((ostream_base *)this,0x22,__buf_00,__n);
  return;
}

Assistant:

void emit_digest (ostream_base & os, uint128 const d) {
                std::array<char, uint128::hex_string_length> hex;
                decltype (hex)::const_iterator const out = d.to_hex (hex.begin ());
                (void) out;
                PSTORE_ASSERT (out == hex.end ());
                os << '"';
                details::write_span (os, gsl::make_span (hex));
                os << '"';
            }